

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::setTearOffEnabled(QMenu *this,bool b)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  uVar2 = (ushort)*(uint *)(lVar1 + 0x420);
  if (((*(uint *)(lVar1 + 0x420) >> 9 & 1) == 0) == b) {
    if (b) {
      uVar3 = 0x201;
    }
    else {
      hideTearOffMenu(this);
      uVar2 = *(ushort *)(lVar1 + 0x420);
      uVar3 = 1;
    }
    *(ushort *)(lVar1 + 0x420) = uVar3 | uVar2 & 0xfdfe;
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      local_20 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
      QWidget::resize(&this->super_QWidget,&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::setTearOffEnabled(bool b)
{
    Q_D(QMenu);
    if (d->tearoff == b)
        return;
    if (!b)
        hideTearOffMenu();
    d->tearoff = b;

    d->itemsDirty = true;
    if (isVisible())
        resize(sizeHint());
}